

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sort.cpp
# Opt level: O1

void ON_SortUINT64Array(sort_algorithm sort_algorithm,ON__UINT64 *a,size_t nel)

{
  ulong uVar1;
  int iVar2;
  ON__UINT64 *pOVar3;
  ulong *puVar4;
  ulong uVar5;
  ulong uVar6;
  ulong *puVar7;
  ulong *puVar8;
  ON__UINT64 OVar9;
  ulong *puVar10;
  ulong uVar11;
  ulong *puVar12;
  ON__UINT64 *lostk [62];
  undefined8 auStack_3f8 [62];
  undefined8 auStack_208 [62];
  
  if (sort_algorithm == heap_sort) {
    if (1 < nel && a != (ON__UINT64 *)0x0) {
      uVar5 = nel >> 1;
      pOVar3 = a + (nel - 1);
      uVar6 = nel - 1;
      do {
        if (uVar5 == 0) {
          OVar9 = *pOVar3;
          *pOVar3 = *a;
          uVar6 = uVar6 - 1;
          if (uVar6 == 0) {
            *a = OVar9;
            return;
          }
          pOVar3 = pOVar3 + -1;
          uVar5 = 0;
        }
        else {
          OVar9 = a[uVar5 - 1];
          uVar5 = uVar5 - 1;
        }
        puVar4 = a + uVar5;
        if (uVar5 * 2 < uVar6) {
          uVar11 = uVar5 * 2 | 1;
          do {
            puVar8 = a + uVar11;
            if (uVar11 < uVar6) {
              puVar7 = puVar8 + 1;
              uVar1 = *puVar8;
              if (uVar1 < *puVar7) {
                puVar8 = puVar8 + 1;
              }
              uVar11 = uVar11 + (uVar1 < *puVar7);
            }
            uVar1 = uVar6;
            if (OVar9 < *puVar8) {
              *puVar4 = *puVar8;
              puVar4 = puVar8;
              uVar1 = uVar11 * 2;
            }
            uVar11 = uVar1 + 1;
          } while (uVar11 <= uVar6);
        }
        *puVar4 = OVar9;
      } while( true );
    }
  }
  else if (1 < nel && a != (ON__UINT64 *)0x0) {
    uVar5 = 0;
    puVar4 = a + (nel - 1);
LAB_005bc039:
    while( true ) {
      iVar2 = (int)uVar5;
      uVar6 = ((long)puVar4 - (long)a >> 3) + 1;
      if (uVar6 < 9) break;
      puVar8 = (ulong *)((long)a + (uVar6 & 0xfffffffffffffffe) * 4);
      uVar6 = *a;
      if (*puVar8 < uVar6) {
        *a = *puVar8;
        *puVar8 = uVar6;
      }
      uVar6 = *a;
      if (*puVar4 < uVar6) {
        *a = *puVar4;
        *puVar4 = uVar6;
      }
      uVar6 = *puVar8;
      puVar7 = a;
      puVar10 = puVar4;
      if (*puVar4 < uVar6) {
        *puVar8 = *puVar4;
        *puVar4 = uVar6;
      }
LAB_005bc091:
      if (puVar7 < puVar8) {
        do {
          puVar7 = puVar7 + 1;
          if (puVar8 <= puVar7) break;
        } while (*puVar7 <= *puVar8);
      }
      if (puVar8 <= puVar7) {
        do {
          puVar7 = puVar7 + 1;
          if (puVar4 < puVar7) break;
        } while (*puVar7 <= *puVar8);
      }
      do {
        puVar12 = puVar10;
        puVar10 = puVar12 + -1;
        if (puVar10 <= puVar8) break;
      } while (*puVar8 < *puVar10);
      if (puVar7 <= puVar10) {
        uVar6 = *puVar7;
        *puVar7 = *puVar10;
        *puVar10 = uVar6;
        if (puVar10 == puVar8) {
          puVar8 = puVar7;
        }
        goto LAB_005bc091;
      }
      if (puVar8 < puVar12) {
        do {
          puVar12 = puVar10;
          if (puVar12 <= puVar8) break;
          puVar10 = puVar12 + -1;
        } while (*puVar12 == *puVar8);
      }
      if (puVar12 <= puVar8) {
        do {
          puVar12 = puVar12 + -1;
          if (puVar12 <= a) break;
        } while (*puVar12 == *puVar8);
      }
      if ((long)puVar12 - (long)a < (long)puVar4 - (long)puVar7) goto LAB_005bc1c0;
      if (a < puVar12) {
        auStack_208[iVar2] = a;
        auStack_3f8[iVar2] = puVar12;
        uVar5 = (ulong)(iVar2 + 1);
      }
      iVar2 = (int)uVar5;
      a = puVar7;
      if (puVar4 <= puVar7) goto LAB_005bc1e3;
    }
    for (; puVar7 = a, puVar8 = a, a < puVar4; puVar4 = puVar4 + -1) {
      while (puVar10 = puVar7, puVar8 = puVar8 + 1, puVar8 <= puVar4) {
        puVar7 = puVar8;
        if (*puVar8 <= *puVar10) {
          puVar7 = puVar10;
        }
      }
      uVar5 = *puVar10;
      *puVar10 = *puVar4;
      *puVar4 = uVar5;
    }
    goto LAB_005bc1e3;
  }
  return;
LAB_005bc1c0:
  if (puVar7 < puVar4) {
    auStack_208[iVar2] = puVar7;
    auStack_3f8[iVar2] = puVar4;
    uVar5 = (ulong)(iVar2 + 1);
  }
  iVar2 = (int)uVar5;
  puVar4 = puVar12;
  if (puVar12 <= a) {
LAB_005bc1e3:
    if (iVar2 < 1) {
      return;
    }
    uVar5 = (ulong)(iVar2 - 1);
    a = (ON__UINT64 *)auStack_208[uVar5];
    puVar4 = (ulong *)auStack_3f8[uVar5];
  }
  goto LAB_005bc039;
}

Assistant:

void ON_SortUINT64Array(
        ON::sort_algorithm sort_algorithm,
        ON__UINT64* a,
        size_t nel
        )
{
  if ( ON::sort_algorithm::heap_sort == sort_algorithm )
    ON_hsort_uint64(a,nel);
  else
    ON_qsort_uint64(a,nel);
}